

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O2

Action __thiscall
psy::C::TypeChecker::visitIdentifierName(TypeChecker *this,IdentifierNameSyntax *node)

{
  DeclarationCategory DVar1;
  int iVar2;
  Scope *this_00;
  Identifier *ident;
  DeclarationSymbol *this_01;
  MIXIN_TypeableDeclarationSymbol *pMVar3;
  undefined4 extraout_var;
  Compilation *pCVar4;
  Type *pTVar5;
  ostream *poVar6;
  Action AVar7;
  
  this_00 = SemanticModel::scopeOf(this->semaModel_,node);
  if (this_00 == (Scope *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    iVar2 = 0x263;
LAB_0030bd57:
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::operator<<(poVar6,"<empty message>");
    std::endl<char,std::char_traits<char>>(poVar6);
    AVar7 = Quit;
  }
  else {
    ident = identifierFrom(node);
    this_01 = Scope::searchForDeclaration(this_00,ident,OrdinaryIdentifiers);
    if (this_01 == (DeclarationSymbol *)0x0) {
      pCVar4 = SemanticModel::compilation(this->semaModel_);
      pTVar5 = &Compilation::canonicalErrorType(pCVar4)->super_Type;
      this->ty_ = pTVar5;
      return Skip;
    }
    DVar1 = DeclarationSymbol::category(this_01);
    AVar7 = Skip;
    if (DVar1 < Type) {
      pMVar3 = MIXIN_TypeableDeclarationSymbol::from(this_01);
      if (pMVar3 == (MIXIN_TypeableDeclarationSymbol *)0x0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        iVar2 = 0x26f;
        goto LAB_0030bd57;
      }
      iVar2 = (*pMVar3->_vptr_MIXIN_TypeableDeclarationSymbol[2])(pMVar3);
      pTVar5 = (Type *)CONCAT44(extraout_var,iVar2);
    }
    else {
      if (DVar1 != Type) {
        return Skip;
      }
      pCVar4 = SemanticModel::compilation(this->semaModel_);
      pTVar5 = &Compilation::canonicalErrorType(pCVar4)->super_Type;
    }
    this->ty_ = pTVar5;
  }
  return AVar7;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitIdentifierName(const IdentifierNameSyntax* node)
{
    auto scope = semaModel_->scopeOf(node);
    PSY_ASSERT_2(scope, return Action::Quit);
    auto decl = scope->searchForDeclaration(
                identifierFrom(node),
                NameSpace::OrdinaryIdentifiers);
    if (!decl)
        ty_ = semaModel_->compilation()->canonicalErrorType();
    else {
        switch (decl->category()) {
            case DeclarationCategory::Member:
            case DeclarationCategory::Function:
            case DeclarationCategory::Object: {
                auto typeableDecl = MIXIN_TypeableDeclarationSymbol::from(decl);
                PSY_ASSERT_2(typeableDecl, return Action::Quit);
                ty_ = typeableDecl->type();
                break;
            }
            case DeclarationCategory::Type:
                ty_ = semaModel_->compilation()->canonicalErrorType();
                break;
        }
    }

    return Action::Skip;
}